

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathDebugDumpNode(FILE *output,xmlNodePtr cur,int depth)

{
  xmlElementType xVar1;
  ulong uVar2;
  char *__ptr;
  size_t sStack_80;
  char shift [100];
  
  for (uVar2 = 0; ((long)uVar2 < (long)depth && (uVar2 < 0x19)); uVar2 = uVar2 + 1) {
    (shift + uVar2 * 2)[0] = ' ';
    (shift + uVar2 * 2)[1] = ' ';
  }
  (shift + uVar2 * 2)[0] = '\0';
  (shift + uVar2 * 2)[1] = '\0';
  if (cur == (xmlNodePtr)0x0) {
    fputs(shift,(FILE *)output);
    __ptr = "Node is NULL !\n";
    sStack_80 = 0xf;
  }
  else {
    xVar1 = cur->type;
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      xmlDebugDumpAttr(output,(xmlAttrPtr)cur,depth);
      return;
    }
    if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
      xmlDebugDumpOneNode(output,cur,depth);
      return;
    }
    fputs(shift,(FILE *)output);
    __ptr = " /\n";
    sStack_80 = 3;
  }
  fwrite(__ptr,sStack_80,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlXPathDebugDumpNode(FILE *output, xmlNodePtr cur, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "Node is NULL !\n");
	return;

    }

    if ((cur->type == XML_DOCUMENT_NODE) ||
	     (cur->type == XML_HTML_DOCUMENT_NODE)) {
	fprintf(output, "%s", shift);
	fprintf(output, " /\n");
    } else if (cur->type == XML_ATTRIBUTE_NODE)
	xmlDebugDumpAttr(output, (xmlAttrPtr)cur, depth);
    else
	xmlDebugDumpOneNode(output, cur, depth);
}